

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableShader::shadeFragments
          (BuiltinVariableShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  uint uVar5;
  GenericVec4 *pGVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  FragmentPacket *packet;
  int fragNdx;
  int iVar10;
  int iVar11;
  Vec4 colors [4];
  deUint32 local_98;
  deUint32 local_94;
  deUint32 local_90;
  deUint32 local_8c;
  ulong local_88;
  FragmentPacket *local_80;
  deUint32 local_78 [18];
  
  local_78[0] = 0x3f800000;
  local_78[1] = 0x3f800000;
  local_78[2] = 0;
  local_78[3] = 0x3f800000;
  local_78[4] = 0x3f800000;
  local_78[5] = 0;
  local_78[6] = 0;
  local_78[7] = 0x3f800000;
  local_78[8] = 0;
  local_78[9] = 0x3f800000;
  local_78[10] = 0;
  local_78[0xb] = 0x3f800000;
  local_78[0xc] = 0;
  local_78[0xd] = 0;
  local_78[0xe] = 0x3f800000;
  local_78[0xf] = 0x3f800000;
  uVar5 = *(uint *)&(this->super_ShaderProgram).field_0x154;
  if (uVar5 < 2) {
    if (0 < numPackets) {
      local_88 = (ulong)(uint)numPackets;
      iVar11 = 0;
      uVar9 = 0;
      local_80 = packets;
      do {
        packet = local_80 + uVar9;
        iVar10 = 0;
        do {
          rr::readVarying<float>((rr *)&local_98,packet,context,0,iVar10);
          pGVar6 = context->outputArray;
          iVar8 = (iVar11 + iVar10) * context->numFragmentOutputs;
          pGVar6[iVar8].v.uData[0] = local_98;
          pGVar6[iVar8].v.uData[1] = local_94;
          pGVar6[iVar8].v.uData[2] = local_90;
          pGVar6[iVar8].v.uData[3] = local_8c;
          iVar10 = iVar10 + 1;
        } while (iVar10 != 4);
        uVar9 = uVar9 + 1;
        iVar11 = iVar11 + 4;
      } while (uVar9 != local_88);
    }
  }
  else if ((uVar5 == 2) && (0 < numPackets)) {
    lVar7 = (long)(context->primitiveID % 4);
    dVar1 = local_78[lVar7 * 4];
    dVar2 = local_78[lVar7 * 4 + 1];
    dVar3 = local_78[lVar7 * 4 + 2];
    dVar4 = local_78[lVar7 * 4 + 3];
    pGVar6 = context->outputArray;
    iVar11 = context->numFragmentOutputs;
    iVar10 = 0;
    uVar9 = 0;
    do {
      lVar7 = 4;
      iVar8 = iVar10;
      do {
        pGVar6[iVar8].v.uData[0] = dVar1;
        pGVar6[iVar8].v.uData[1] = dVar2;
        pGVar6[iVar8].v.uData[2] = dVar3;
        pGVar6[iVar8].v.uData[3] = dVar4;
        iVar8 = iVar8 + iVar11;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
      uVar9 = uVar9 + 1;
      iVar10 = iVar10 + iVar11 * 4;
    } while (uVar9 != (uint)numPackets);
  }
  return;
}

Assistant:

void BuiltinVariableShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { yellow, red, green, blue };

	if (m_test == TEST_POINT_SIZE || m_test == TEST_PRIMITIVE_ID_IN)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readVarying<float>(packets[packetNdx], context, 0, fragNdx));
	}
	else if (m_test == TEST_PRIMITIVE_ID)
	{
		const tcu::Vec4 color = colors[context.primitiveID % 4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
	}
	else
		DE_ASSERT(DE_FALSE);
}